

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  bool bVar2;
  int iVar3;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_ESI;
  undefined1 in_DIL;
  char ret;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint uVar4;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar5;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffff0;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar6;
  int local_4;
  
  uVar6 = CONCAT13(in_DIL,in_stack_fffffffffffffff4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffff0);
  SVar5.m_int = in_ESI.m_int;
  bVar2 = DivisionCornerCaseHelper<int,_signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1
                    ((char)((uint)uVar6 >> 0x18),in_ESI,
                     (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &stack0xfffffffffffffff0);
  SVar1.m_int = in_stack_fffffffffffffff0.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<int,_signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
              ::DivisionCornerCase2
                        ((char)((uint)SVar5.m_int >> 0x18),in_stack_fffffffffffffff0,
                         (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
     SVar1.m_int = in_stack_fffffffffffffff0.m_int, !bVar2)) {
    uVar4 = in_stack_ffffffffffffffe4 & 0xffffff;
    iVar3 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) &
                       0xffffffffffffff));
    DivisionHelper<signed_char,_int,_5>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)CONCAT44(uVar6,in_stack_fffffffffffffff0.m_int),
               (int *)CONCAT44(SVar5.m_int,in_ESI.m_int),(char *)CONCAT44(uVar4,iVar3));
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<signed_char>
              ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffd8);
    SVar1.m_int = local_4;
  }
  local_4 = SVar1.m_int;
  return (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_4;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}